

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_util.h
# Opt level: O3

string * __thiscall
(anonymous_namespace)::
join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          iter,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               end,string *delim)

{
  string *in_RAX;
  string *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this == iter._M_current)
  {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)this,*(long *)(this + 8) + *(long *)this);
    in_RAX = extraout_RAX;
    for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x20)
        ; pbVar1 != iter._M_current; pbVar1 = pbVar1 + 1) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)((end._M_current)->_M_dataplus)._M_p);
      in_RAX = (string *)
               std::__cxx11::string::_M_append
                         ((char *)__return_storage_ptr__,(ulong)(pbVar1->_M_dataplus)._M_p);
    }
  }
  return in_RAX;
}

Assistant:

std::string join(I iter, I end, std::string const& delim) {
		if (iter==end)
			return {};
		
		std::string ret = *iter;
		for(++iter; iter!=end; ++iter) {
			ret.append(delim);
			ret.append(*iter);
		}
		return ret;
	}